

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gather.cpp
# Opt level: O0

void duckdb::RowOperations::Gather
               (Vector *rows,SelectionVector *row_sel,Vector *col,SelectionVector *col_sel,
               idx_t count,RowLayout *layout,idx_t col_no,idx_t build_size,data_ptr_t heap_ptr)

{
  PhysicalType PVar1;
  LogicalType *this;
  undefined8 uVar2;
  Vector *in_RDX;
  RowLayout *in_stack_00000008;
  idx_t in_stack_00000010;
  RowLayout *in_stack_00000018;
  Vector *in_stack_00000020;
  SelectionVector *in_stack_00000028;
  Vector *in_stack_00000030;
  SelectionVector *in_stack_00000038;
  Vector *in_stack_00000040;
  idx_t in_stack_00000048;
  idx_t in_stack_00000050;
  idx_t in_stack_00000058;
  SelectionVector *in_stack_00000098;
  idx_t in_stack_000000b8;
  data_ptr_t in_stack_000000c0;
  string *in_stack_ffffffffffffff68;
  InternalException *in_stack_ffffffffffffff70;
  VectorType in_stack_ffffffffffffff9f;
  Vector *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [56];
  Vector *local_18;
  
  local_18 = in_RDX;
  Vector::SetVectorType(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  this = Vector::GetType(local_18);
  PVar1 = LogicalType::InternalType(this);
  switch(PVar1) {
  case BOOL:
  case INT8:
    TemplatedGatherLoop<signed_char>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case UINT8:
    TemplatedGatherLoop<unsigned_char>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case UINT16:
    TemplatedGatherLoop<unsigned_short>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case INT16:
    TemplatedGatherLoop<short>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case UINT32:
    TemplatedGatherLoop<unsigned_int>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case INT32:
    TemplatedGatherLoop<int>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case UINT64:
    TemplatedGatherLoop<unsigned_long>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case INT64:
    TemplatedGatherLoop<long>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case FLOAT:
    TemplatedGatherLoop<float>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case DOUBLE:
    TemplatedGatherLoop<double>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,
               (SelectionVector *)in_stack_00000018,in_stack_00000010,in_stack_00000008,
               (idx_t)in_stack_00000040,in_stack_00000048);
    break;
  case INTERVAL:
    TemplatedGatherLoop<duckdb::interval_t>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
               (idx_t)in_stack_00000020,in_stack_00000018,in_stack_00000050,in_stack_00000058);
    break;
  case LIST:
  case STRUCT:
  case ARRAY:
    GatherNestedVector(rows,row_sel,col,col_sel,count,layout,col_no,(data_ptr_t)build_size);
    break;
  case VARCHAR:
    GatherVarchar((Vector *)col_no,in_stack_00000098,rows,row_sel,(idx_t)col,(RowLayout *)col_sel,
                  (idx_t)heap_ptr,in_stack_000000b8,in_stack_000000c0);
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_50,"Unimplemented type for RowOperations::Gather",&local_51);
    InternalException::InternalException(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
  case UINT128:
    TemplatedGatherLoop<duckdb::uhugeint_t>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
               (idx_t)in_stack_00000020,in_stack_00000018,in_stack_00000050,in_stack_00000058);
    break;
  case INT128:
    TemplatedGatherLoop<duckdb::hugeint_t>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
               (idx_t)in_stack_00000020,in_stack_00000018,in_stack_00000050,in_stack_00000058);
  }
  return;
}

Assistant:

void RowOperations::Gather(Vector &rows, const SelectionVector &row_sel, Vector &col, const SelectionVector &col_sel,
                           const idx_t count, const RowLayout &layout, const idx_t col_no, const idx_t build_size,
                           data_ptr_t heap_ptr) {
	D_ASSERT(rows.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rows.GetType().id() == LogicalTypeId::POINTER); // "Cannot gather from non-pointer type!"

	col.SetVectorType(VectorType::FLAT_VECTOR);
	switch (col.GetType().InternalType()) {
	case PhysicalType::UINT8:
		TemplatedGatherLoop<uint8_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT16:
		TemplatedGatherLoop<uint16_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT32:
		TemplatedGatherLoop<uint32_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT64:
		TemplatedGatherLoop<uint64_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT128:
		TemplatedGatherLoop<uhugeint_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedGatherLoop<int8_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT16:
		TemplatedGatherLoop<int16_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT32:
		TemplatedGatherLoop<int32_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT64:
		TemplatedGatherLoop<int64_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT128:
		TemplatedGatherLoop<hugeint_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::FLOAT:
		TemplatedGatherLoop<float>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGatherLoop<double>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INTERVAL:
		TemplatedGatherLoop<interval_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::VARCHAR:
		GatherVarchar(rows, row_sel, col, col_sel, count, layout, col_no, build_size, heap_ptr);
		break;
	case PhysicalType::LIST:
	case PhysicalType::STRUCT:
	case PhysicalType::ARRAY:
		GatherNestedVector(rows, row_sel, col, col_sel, count, layout, col_no, heap_ptr);
		break;
	default:
		throw InternalException("Unimplemented type for RowOperations::Gather");
	}
}